

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

BinarySection *
flatbuffers::anon_unknown_49::GenerateMissingSection
          (BinarySection *__return_storage_ptr__,uint64_t offset,uint64_t length,uint8_t *binary)

{
  ulong uVar1;
  BinarySection *extraout_RAX;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  long *plVar5;
  bool bVar6;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_2f8;
  BinaryRegionStatus local_2d8;
  undefined1 *local_2d0;
  long local_2c8;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  BinaryRegionCommentType local_2b0;
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298;
  undefined7 uStack_297;
  undefined1 *local_288;
  long local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  size_t local_268;
  BinarySection *local_260;
  long *local_258 [2];
  long local_248 [2];
  undefined1 local_238 [48];
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  BinaryRegionCommentType local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  size_t local_e8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  BinaryRegionCommentType local_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  size_t local_70;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_68;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  local_2f8.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (offset < length + offset) {
    if (binary[offset] == '\0') {
      lVar2 = length - 1;
      uVar1 = offset + 1;
      do {
        uVar4 = uVar1;
        bVar6 = lVar2 == 0;
        lVar2 = lVar2 + -1;
        if (bVar6) break;
        uVar1 = uVar4 + 1;
      } while (binary[uVar4] == '\0');
      if (length + offset <= uVar4) goto LAB_00310150;
    }
    local_2d8 = 0;
    local_2d0 = &local_2c0;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2a8 = &local_298;
    local_2a0 = 0;
    local_298 = 0;
    local_288 = &local_278;
    local_280 = 0;
    local_278 = 0;
    local_268 = 0;
    local_2b0 = Unknown;
    local_260 = __return_storage_ptr__;
    if (length < 8) {
      plVar3 = local_188;
      local_198[0] = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
      local_2d8 = WARN_CORRUPTED_PADDING;
      std::__cxx11::string::_M_assign((string *)&local_2d0);
      plVar5 = local_198[0];
    }
    else {
      plVar3 = local_168;
      local_178[0] = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"");
      local_2d8 = WARN_NO_REFERENCES;
      std::__cxx11::string::_M_assign((string *)&local_2d0);
      plVar5 = local_178[0];
    }
    if (plVar5 != plVar3) {
      operator_delete(plVar5,*plVar3 + 1);
    }
    local_e0._0_4_ = local_2d8;
    local_d8._M_p = (pointer)&local_c8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_2d0,local_2d0 + local_2c8);
    local_b8 = local_2b0;
    local_b0._M_p = (pointer)&local_a0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_2a8,local_2a8 + local_2a0);
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_288,local_288 + local_280);
    local_70 = local_268;
    MakeBinaryRegion((BinaryRegion *)local_238,offset,length,Unknown,length,0,
                     (BinaryRegionComment *)local_e0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_2f8,(BinaryRegion *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_p != &local_1f8) {
      operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != &local_c8) {
      operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
    }
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"no known references","");
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2f8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2f8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2f8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MakeBinarySection(local_260,(string *)local_238,Unknown,&local_48);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_48);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
    }
    if (local_2d0 == &local_2c0) goto LAB_0031046e;
  }
  else {
LAB_00310150:
    local_2d0 = &local_2c0;
    local_2d8 = OK;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2a8 = &local_298;
    local_2a0 = 0;
    local_298 = 0;
    local_288 = &local_278;
    local_280 = 0;
    local_278 = 0;
    local_268 = 0;
    local_2b0 = Padding;
    if (7 < length) {
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"");
      local_2d8 = WARN_PADDING_LENGTH;
      std::__cxx11::string::_M_assign((string *)&local_2d0);
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
    }
    local_158._0_4_ = local_2d8;
    local_150._M_p = (pointer)&local_140;
    std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_2d0,local_2d0 + local_2c8);
    local_130 = local_2b0;
    local_128._M_p = (pointer)&local_118;
    std::__cxx11::string::_M_construct<char*>((string *)&local_128,local_2a8,local_2a8 + local_2a0);
    local_108._M_p = (pointer)&local_f8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_288,local_288 + local_280);
    local_e8 = local_268;
    MakeBinaryRegion((BinaryRegion *)local_238,offset,length,Uint8,length,0,
                     (BinaryRegionComment *)local_158);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_2f8,(BinaryRegion *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_p != &local_1b0) {
      operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != &local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_p != &local_1f8) {
      operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_p != &local_118) {
      operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_p != &local_140) {
      operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
    }
    local_238._0_8_ = local_238 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
    local_68.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2f8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_68.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2f8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_68.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2f8.
         super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.
    super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MakeBinarySection(__return_storage_ptr__,(string *)local_238,Padding,&local_68);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_68);
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,CONCAT71(uStack_297,local_298) + 1);
    }
    if (local_2d0 == &local_2c0) goto LAB_0031046e;
  }
  operator_delete(local_2d0,CONCAT71(uStack_2bf,local_2c0) + 1);
LAB_0031046e:
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_2f8);
  return extraout_RAX;
}

Assistant:

static BinarySection GenerateMissingSection(const uint64_t offset,
                                            const uint64_t length,
                                            const uint8_t *const binary) {
  std::vector<BinaryRegion> regions;

  // Check if the region is all zeros or not, as that can tell us if it is
  // padding or not.
  if (IsNonZeroRegion(offset, length, binary)) {
    // Some of the padding bytes are non-zero, so this might be an unknown
    // section of the binary.
    // TODO(dbaileychess): We could be a bit smarter with different sized
    // alignments. For now, the 8 byte check encompasses all the smaller
    // alignments.
    BinaryRegionComment comment;
    comment.type = BinaryRegionCommentType::Unknown;
    if (length >= 8) {
      SetError(comment, BinaryRegionStatus::WARN_NO_REFERENCES);
    } else {
      SetError(comment, BinaryRegionStatus::WARN_CORRUPTED_PADDING);
    }

    regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                       BinaryRegionType::Unknown, length, 0,
                                       comment));

    return MakeBinarySection("no known references", BinarySectionType::Unknown,
                             std::move(regions));
  }

  BinaryRegionComment comment;
  comment.type = BinaryRegionCommentType::Padding;
  if (length >= 8) {
    SetError(comment, BinaryRegionStatus::WARN_PADDING_LENGTH);
  }

  // This region is most likely padding.
  regions.push_back(MakeBinaryRegion(offset, length * sizeof(uint8_t),
                                     BinaryRegionType::Uint8, length, 0,
                                     comment));

  return MakeBinarySection("", BinarySectionType::Padding, std::move(regions));
}